

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

bool __thiscall
bloaty::anon_unknown_0::ElfObjectFile::GetDisassemblyInfo
          (ElfObjectFile *this,string_view symbol,DataSource symbol_source,DisassemblyInfo *info)

{
  bool bVar1;
  DisassemblyInfo *in_stack_00000630;
  DataSource in_stack_0000063c;
  string_view *in_stack_00000640;
  ElfObjectFile *in_stack_00000648;
  
  bVar1 = DoGetDisassemblyInfo
                    (in_stack_00000648,in_stack_00000640,in_stack_0000063c,in_stack_00000630);
  return bVar1;
}

Assistant:

bool GetDisassemblyInfo(const std::string_view symbol,
                          DataSource symbol_source,
                          DisassemblyInfo* info) const override {
    return DoGetDisassemblyInfo(&symbol, symbol_source, info);
  }